

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

boolean maybe_finished_meal(boolean stopping)

{
  boolean local_9;
  boolean stopping_local;
  
  if ((occupation == eatfood) && (victual.reqtime <= victual.usedtime)) {
    if (stopping != '\0') {
      occupation = (_func_int *)0x0;
    }
    eatfood();
    local_9 = '\x01';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

boolean maybe_finished_meal(boolean stopping)
{
	/* in case consume_oeaten() has decided that the food is all gone */
	if (occupation == eatfood && victual.usedtime >= victual.reqtime) {
	    if (stopping) occupation = 0;	/* for do_reset_eat */
	    eatfood(); /* calls done_eating() to use up victual.piece */
	    return TRUE;
	}
	return FALSE;
}